

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

value * __thiscall cppcms::json::value::operator[](value *this,string *name)

{
  bool bVar1;
  json_type jVar2;
  pointer ppVar3;
  undefined1 uVar4;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_value>_>::value,_pair<iterator,_bool>_>
  _Var5;
  iterator p;
  object *self;
  map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
  *in_stack_fffffffffffffec8;
  object *this_00;
  string *in_stack_fffffffffffffed8;
  _Self local_a0 [7];
  _Self local_68;
  object *local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  value *local_8;
  
  jVar2 = type((value *)0x1185b9);
  if (jVar2 != is_object) {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    std::
    map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
    ::map((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
           *)0x1185eb);
    set_value<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
              ((value *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    std::
    map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
    ::~map((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            *)0x118609);
  }
  local_60 = object((value *)0x11863b);
  string_key::unowned(in_stack_fffffffffffffed8);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
       ::find(in_stack_fffffffffffffeb8,(key_type *)0x118679);
  string_key::~string_key((string_key *)0x11869a);
  local_a0[0]._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
       ::end(in_stack_fffffffffffffeb8);
  bVar1 = std::operator==(&local_68,local_a0);
  if (bVar1) {
    this_00 = local_60;
    value((value *)0x1186f6);
    std::make_pair<std::__cxx11::string_const&,cppcms::json::value>
              (&in_stack_fffffffffffffec8->first,
               (value *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    _Var5 = std::
            map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
            ::insert<std::pair<std::__cxx11::string,cppcms::json::value>>
                      (this_00,in_stack_fffffffffffffec8);
    uVar4 = _Var5.second;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
             operator->((_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
                         *)0x11875d);
    local_8 = &ppVar3->second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
             *)CONCAT17(uVar4,in_stack_fffffffffffffec0));
    ~value((value *)0x11877d);
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
             operator->((_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>
                         *)0x1187ef);
    local_8 = &ppVar3->second;
  }
  return local_8;
}

Assistant:

value &value::operator[](std::string const &name)
	{
		if(type()!=json::is_object)
			set_value(json::object());

		json::object &self=object();

		json::object::iterator p=self.find(string_key::unowned(name));
		if(p==self.end())
			return self.insert(std::make_pair(name,value())).first->second;
		return p->second;
	}